

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

int svd(double *A,int M,int N,double *U,double *V,double *q)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  void *__ptr;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  double *pdVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  size_t __size;
  double *pdVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  double *pdVar30;
  double *pdVar31;
  long lVar32;
  uint uVar33;
  ulong uVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double __x;
  double dVar38;
  double dVar39;
  double macheps;
  double dVar40;
  double dVar41;
  double dVar42;
  double *local_118;
  ulong local_100;
  int local_e8;
  double *local_c0;
  int local_a8;
  double *local_80;
  uint local_70;
  void *local_68;
  double *local_48;
  double *local_38;
  
  if (M < N) {
    puts("Rows (M) should be greater than Columns (B) ");
    printf("Retry By Transposing the Input Matrix");
    iVar2 = -1;
  }
  else {
    __size = (long)N << 3;
    __ptr = malloc(__size);
    dVar40 = 1.0;
    do {
      dVar40 = dVar40 * 0.5;
    } while (1.0 < dVar40 + 1.0);
    if (0 < N * M) {
      uVar10 = 0;
      do {
        U[uVar10] = A[uVar10];
        uVar10 = uVar10 + 1;
      } while ((uint)(N * M) != uVar10);
    }
    lVar6 = (long)M;
    uVar10 = (ulong)(uint)N;
    uVar23 = (ulong)(uint)M;
    if (N < 1) {
      dVar39 = 0.0;
      dVar41 = 0.0;
    }
    else {
      pdVar9 = U + 1;
      local_c0 = U + uVar10;
      uVar15 = 1;
      uVar18 = 0;
      dVar42 = 0.0;
      dVar39 = 0.0;
      uVar11 = uVar23;
      uVar20 = 0;
      uVar34 = uVar10;
      dVar36 = 0.0;
      local_80 = U;
      local_68 = __ptr;
      local_38 = U;
      do {
        __size = uVar20 + 1;
        *(double *)((long)__ptr + uVar20 * 8) = dVar42 * dVar39;
        dVar39 = 0.0;
        dVar41 = 0.0;
        local_a8 = (int)uVar20;
        uVar7 = uVar11;
        pdVar8 = local_38;
        if ((long)uVar20 < lVar6) {
          do {
            dVar41 = dVar41 + ABS(*pdVar8);
            uVar7 = uVar7 - 1;
            pdVar8 = pdVar8 + uVar10;
          } while (uVar7 != 0);
          dVar39 = 0.0;
          if ((dVar41 != 0.0) || (NAN(dVar41))) {
            dVar42 = 0.0;
            uVar7 = uVar11;
            pdVar8 = local_38;
            do {
              dVar39 = *pdVar8 / dVar41;
              *pdVar8 = dVar39;
              dVar42 = dVar42 + dVar39 * dVar39;
              pdVar8 = pdVar8 + uVar10;
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
            iVar2 = (N + 1) * local_a8;
            dVar37 = U[iVar2];
            if (dVar42 < 0.0) {
              dVar39 = sqrt(dVar42);
            }
            else {
              dVar39 = SQRT(dVar42);
            }
            dVar39 = (double)(~-(ulong)(dVar37 < 0.0) & (ulong)-dVar39 |
                             -(ulong)(dVar37 < 0.0) & (ulong)dVar39);
            U[iVar2] = dVar37 - dVar39;
            if (__size < uVar10 && (long)uVar20 < (long)(int)(N - 1U)) {
              pdVar8 = pdVar9;
              uVar7 = uVar15;
              do {
                dVar35 = 0.0;
                if ((long)uVar20 < lVar6) {
                  lVar24 = 0;
                  uVar16 = uVar11;
                  do {
                    dVar35 = dVar35 + *(double *)((long)local_38 + lVar24) *
                                      *(double *)((long)pdVar8 + lVar24);
                    lVar24 = lVar24 + uVar10 * 8;
                    uVar16 = uVar16 - 1;
                  } while (uVar16 != 0);
                }
                if ((long)uVar20 < lVar6) {
                  lVar24 = 0;
                  uVar16 = uVar11;
                  do {
                    *(double *)((long)pdVar8 + lVar24) =
                         *(double *)((long)local_38 + lVar24) *
                         (dVar35 / (dVar37 * dVar39 - dVar42)) + *(double *)((long)pdVar8 + lVar24);
                    lVar24 = lVar24 + uVar10 * 8;
                    uVar16 = uVar16 - 1;
                  } while (uVar16 != 0);
                }
                uVar7 = uVar7 + 1;
                pdVar8 = pdVar8 + 1;
              } while (uVar7 != uVar10);
            }
            uVar7 = uVar11;
            pdVar8 = local_38;
            if ((long)uVar20 < lVar6) {
              do {
                *pdVar8 = *pdVar8 * dVar41;
                uVar7 = uVar7 - 1;
                pdVar8 = pdVar8 + uVar10;
              } while (uVar7 != 0);
            }
          }
        }
        q[uVar20] = dVar39 * dVar41;
        dVar42 = 0.0;
        dVar39 = 0.0;
        if (uVar20 != N - 1U && (long)uVar20 < lVar6) {
          if ((long)__size < lVar6) {
            uVar7 = 1;
            do {
              dVar42 = dVar42 + ABS(local_80[uVar18 + uVar7]);
              uVar7 = uVar7 + 1;
            } while (uVar11 != uVar7);
          }
          if ((dVar42 != 0.0) || (dVar39 = 0.0, NAN(dVar42))) {
            dVar41 = 0.0;
            if (__size < uVar10) {
              uVar7 = 1;
              do {
                dVar39 = local_80[uVar18 + uVar7] / dVar42;
                local_80[uVar18 + uVar7] = dVar39;
                dVar41 = dVar41 + dVar39 * dVar39;
                uVar7 = uVar7 + 1;
              } while (uVar34 != uVar7);
            }
            uVar33 = (int)__size + local_a8 * N;
            dVar37 = U[uVar33];
            if (dVar41 < 0.0) {
              dVar39 = sqrt(dVar41);
            }
            else {
              dVar39 = SQRT(dVar41);
            }
            dVar39 = (double)(~-(ulong)(dVar37 < 0.0) & (ulong)-dVar39 |
                             -(ulong)(dVar37 < 0.0) & (ulong)dVar39);
            U[uVar33] = dVar37 - dVar39;
            if (__size < uVar10) {
              uVar7 = 1;
              do {
                *(double *)((long)local_68 + uVar7 * 8) =
                     local_80[uVar18 + uVar7] / (dVar37 * dVar39 - dVar41);
                uVar7 = uVar7 + 1;
              } while (uVar34 != uVar7);
            }
            pdVar8 = local_c0;
            uVar7 = uVar15;
            if ((long)__size < lVar6) {
              do {
                dVar41 = 0.0;
                if (__size < uVar10) {
                  uVar16 = 1;
                  do {
                    dVar41 = dVar41 + pdVar8[uVar16] * local_80[uVar18 + uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar34 != uVar16);
                }
                if (__size < uVar10) {
                  uVar16 = 1;
                  do {
                    pdVar8[uVar16] =
                         *(double *)((long)local_68 + uVar16 * 8) * dVar41 + pdVar8[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar34 != uVar16);
                }
                uVar7 = uVar7 + 1;
                pdVar8 = pdVar8 + uVar10;
              } while (uVar7 != uVar23);
            }
            if (__size < uVar10) {
              uVar7 = 1;
              do {
                local_80[uVar18 + uVar7] = local_80[uVar18 + uVar7] * dVar42;
                uVar7 = uVar7 + 1;
              } while (uVar34 != uVar7);
            }
          }
        }
        dVar41 = ABS(*(double *)((long)__ptr + uVar20 * 8)) + ABS(q[uVar20]);
        if (dVar41 <= dVar36) {
          dVar41 = dVar36;
        }
        uVar15 = uVar15 + 1;
        local_38 = local_38 + uVar10 + 1;
        uVar11 = uVar11 - 1;
        pdVar9 = pdVar9 + uVar10 + 1;
        local_80 = local_80 + 1;
        uVar18 = (ulong)(uint)((int)uVar18 + N);
        uVar34 = uVar34 - 1;
        local_68 = (void *)((long)local_68 + 8);
        local_c0 = local_c0 + uVar10 + 1;
        uVar20 = __size;
        dVar36 = dVar41;
      } while (__size != uVar10);
    }
    uVar33 = N - 1;
    lVar24 = (long)(int)uVar33;
    if (0 < N) {
      lVar17 = (uVar10 - 1) * uVar10;
      pdVar9 = U + lVar17;
      lVar12 = uVar10 * 8;
      pdVar8 = V + uVar10;
      pdVar19 = V + lVar17;
      uVar11 = uVar10;
      pdVar30 = V;
      do {
        pdVar30 = pdVar30 + -1;
        pdVar8 = pdVar8 + -1;
        uVar20 = uVar11 - 1;
        if ((long)uVar11 <= lVar24) {
          local_48._0_4_ = (int)__size;
          if ((dVar39 != 0.0) || (NAN(dVar39))) {
            if ((int)local_48 < N) {
              dVar36 = U[uVar20 * uVar10 + uVar11];
              uVar34 = (ulong)(int)local_48;
              pdVar25 = (double *)(lVar12 * uVar34 + (long)pdVar8);
              do {
                *pdVar25 = pdVar9[uVar34] / (dVar39 * dVar36);
                uVar34 = uVar34 + 1;
                pdVar25 = pdVar25 + uVar10;
              } while (uVar10 != uVar34);
            }
            if ((int)local_48 < N) {
              uVar15 = (ulong)(int)local_48;
              pdVar25 = (double *)((uVar10 * 8 + 8) * uVar15 + (long)V);
              uVar34 = uVar15;
              do {
                dVar39 = 0.0;
                uVar18 = uVar15;
                pdVar31 = pdVar25;
                do {
                  dVar39 = dVar39 + pdVar9[uVar18] * *pdVar31;
                  uVar18 = uVar18 + 1;
                  pdVar31 = pdVar31 + uVar10;
                } while (uVar10 != uVar18);
                lVar32 = 0;
                lVar17 = uVar10 - uVar15;
                do {
                  *(double *)((long)pdVar25 + lVar32) =
                       *(double *)((long)pdVar30 + lVar32 + (uVar15 * 8 + 8) * uVar10) * dVar39 +
                       *(double *)((long)pdVar25 + lVar32);
                  lVar32 = lVar32 + lVar12;
                  lVar17 = lVar17 + -1;
                } while (lVar17 != 0);
                uVar34 = uVar34 + 1;
                pdVar25 = pdVar25 + 1;
              } while (uVar34 != uVar10);
            }
          }
          if ((int)local_48 < N) {
            uVar34 = (ulong)(int)local_48;
            pdVar25 = (double *)(lVar12 * uVar34 + (long)pdVar8);
            do {
              *pdVar25 = 0.0;
              pdVar19[uVar34] = 0.0;
              uVar34 = uVar34 + 1;
              pdVar25 = pdVar25 + uVar10;
            } while (uVar10 != uVar34);
          }
        }
        V[uVar20 + (long)((int)uVar20 * N)] = 1.0;
        dVar39 = *(double *)((long)__ptr + uVar20 * 8);
        pdVar9 = pdVar9 + -uVar10;
        pdVar19 = pdVar19 + -uVar10;
        __size = uVar20 & 0xffffffff;
        bVar1 = 1 < (long)uVar11;
        uVar11 = uVar20;
      } while (bVar1);
    }
    local_100 = (ulong)uVar33;
    if (0 < N) {
      uVar13 = N * N;
      uVar3 = ~N;
      local_48 = U + uVar10 * uVar10 + -1;
      uVar21 = (N + 1U) * N;
      uVar4 = uVar21 - 1;
      uVar29 = uVar13 - 1;
      uVar20 = 0;
      uVar11 = uVar10;
      local_70 = uVar13;
      do {
        dVar39 = q[uVar11 - 1];
        if ((long)uVar11 < (long)uVar10 && (long)uVar11 <= lVar24) {
          memset(U + (int)(uVar3 * (int)uVar20 + uVar13),0,
                 (uVar20 * 8 + 0x7fffffff8 & 0x7fffffff8) + 8);
        }
        uVar34 = uVar11 - 1;
        if ((dVar39 != 0.0) || (NAN(dVar39))) {
          if ((long)uVar11 < (long)uVar10 && uVar34 != local_100) {
            uVar15 = uVar11 & 0xffffffff;
            uVar14 = local_70;
            uVar22 = uVar21;
            do {
              dVar36 = 0.0;
              if ((long)uVar11 < lVar6) {
                uVar18 = uVar11 & 0xffffffff;
                uVar27 = uVar4;
                uVar28 = uVar22;
                do {
                  dVar36 = dVar36 + U[uVar27] * U[uVar28];
                  uVar28 = uVar28 + N;
                  uVar27 = uVar27 + N;
                  uVar26 = (int)uVar18 + 1;
                  uVar18 = (ulong)uVar26;
                } while ((int)uVar26 < M);
              }
              if ((long)uVar11 <= lVar6) {
                dVar42 = U[uVar34 * (N + 1U)];
                uVar26 = uVar33;
                uVar28 = uVar29;
                uVar27 = uVar14;
                do {
                  U[uVar27] = U[uVar28] * ((dVar36 / dVar42) / dVar39) + U[uVar27];
                  uVar27 = uVar27 + N;
                  uVar28 = uVar28 + N;
                  uVar26 = uVar26 + 1;
                } while ((int)uVar26 < M);
              }
              uVar28 = (int)uVar15 + 1;
              uVar15 = (ulong)uVar28;
              uVar22 = uVar22 + 1;
              uVar14 = uVar14 + 1;
            } while (uVar28 != N);
          }
          uVar15 = lVar6 + 1U;
          pdVar9 = local_48;
          if ((long)uVar11 <= lVar6) {
            do {
              *pdVar9 = *pdVar9 / dVar39;
              uVar15 = uVar15 - 1;
              pdVar9 = pdVar9 + uVar10;
            } while (uVar11 != uVar15);
          }
        }
        else {
          uVar15 = lVar6 + 1U;
          pdVar9 = local_48;
          if ((long)uVar11 <= lVar6) {
            do {
              *pdVar9 = 0.0;
              pdVar9 = pdVar9 + uVar10;
              uVar15 = uVar15 - 1;
            } while (uVar11 != uVar15);
          }
        }
        lVar12 = (long)((int)uVar34 * N);
        U[uVar34 + lVar12] = U[uVar34 + lVar12] + 1.0;
        uVar20 = uVar20 + 1;
        local_48 = (double *)((long)local_48 + (uVar10 * 8 ^ 0xfffffffffffffff8));
        uVar21 = uVar21 + uVar3;
        uVar4 = uVar4 + uVar3;
        local_70 = local_70 + uVar3;
        uVar29 = uVar29 + uVar3;
        uVar33 = uVar33 - 1;
        uVar11 = uVar34;
      } while (uVar20 != uVar10);
    }
    if (0 < N) {
      dVar41 = (dVar40 + dVar40) * dVar41;
      local_118 = V + uVar10;
      uVar11 = uVar10 - 1;
      local_e8 = N;
LAB_0012207a:
      local_118 = local_118 + -1;
      uVar34 = uVar11 - 1;
      iVar5 = 1;
      uVar20 = local_100;
      iVar2 = local_e8;
LAB_001220a3:
      if (dVar41 < ABS(*(double *)((long)__ptr + uVar20 * 8))) {
        if (dVar41 < ABS(q[uVar20 - 1])) goto code_r0x001220c8;
        goto LAB_001220d1;
      }
      goto LAB_00122228;
    }
LAB_00122677:
    svd_sort(U,M,N,V,q);
    free(__ptr);
    iVar2 = 0;
  }
  return iVar2;
code_r0x001220c8:
  uVar20 = uVar20 - 1;
  iVar2 = iVar2 + -1;
  if (0 < iVar2) goto LAB_001220a3;
LAB_001220d1:
  iVar2 = (int)uVar20;
  if ((long)iVar2 <= (long)uVar11) {
    lVar12 = (long)((uVar20 << 0x20) + -0x100000000) >> 0x1d;
    lVar6 = (long)iVar2 * 8;
    dVar40 = 0.0;
    dVar39 = 1.0;
    lVar24 = (long)iVar2;
    do {
      dVar36 = *(double *)((long)__ptr + lVar24 * 8);
      dVar39 = dVar39 * dVar36;
      *(double *)((long)__ptr + lVar24 * 8) = dVar40 * dVar36;
      if (ABS(dVar39) <= dVar41) break;
      dVar40 = q[lVar24];
      dVar36 = hypot(dVar39,dVar40);
      q[lVar24] = dVar36;
      dVar40 = dVar40 / dVar36;
      dVar39 = -dVar39 / dVar36;
      uVar15 = uVar23;
      pdVar9 = U;
      if (0 < M) {
        do {
          dVar36 = *(double *)((long)pdVar9 + lVar12);
          dVar42 = *(double *)((long)pdVar9 + lVar6);
          *(double *)((long)pdVar9 + lVar12) = dVar36 * dVar40 + dVar39 * dVar42;
          *(double *)((long)pdVar9 + lVar6) = dVar42 * dVar40 - dVar39 * dVar36;
          uVar15 = uVar15 - 1;
          pdVar9 = pdVar9 + uVar10;
        } while (uVar15 != 0);
      }
      lVar6 = lVar6 + 8;
      bVar1 = lVar24 < (long)uVar11;
      lVar24 = lVar24 + 1;
    } while (bVar1);
  }
LAB_00122228:
  dVar40 = q[uVar11];
  if ((uVar20 & 0xffffffff) != uVar11) {
    lVar6 = (long)(int)uVar20;
    dVar39 = q[lVar6];
    dVar36 = q[uVar34];
    dVar42 = *(double *)((long)__ptr + uVar34 * 8);
    dVar37 = *(double *)((long)__ptr + uVar11 * 8);
    dVar42 = ((dVar36 / dVar37 + ((dVar42 - dVar40) / dVar36) * ((dVar40 + dVar42) / dVar37)) -
             dVar37 / dVar36) * 0.5;
    dVar35 = hypot(dVar42,1.0);
    dVar40 = (dVar37 / dVar39) *
             (dVar36 / ((double)((ulong)-dVar35 & -(ulong)(dVar42 < 0.0) |
                                ~-(ulong)(dVar42 < 0.0) & (ulong)dVar35) + dVar42) - dVar37) +
             (dVar39 - (dVar40 / dVar39) * dVar40);
    if (lVar6 < (long)uVar11) {
      pdVar9 = V + lVar6 + 1;
      lVar12 = lVar6 << 0x20;
      pdVar8 = U + lVar6 + 1;
      dVar42 = 1.0;
      dVar36 = 1.0;
      lVar24 = (long)(int)uVar20;
      do {
        lVar17 = lVar24 + 1;
        dVar37 = *(double *)((long)__ptr + lVar24 * 8 + 8);
        dVar35 = q[lVar24 + 1];
        dVar42 = dVar42 * dVar37;
        dVar36 = dVar36 * dVar37;
        dVar37 = hypot(dVar40,dVar42);
        *(double *)((long)__ptr + lVar24 * 8) = dVar37;
        dVar40 = dVar40 / dVar37;
        dVar37 = dVar42 / dVar37;
        __x = dVar39 * dVar40 + dVar36 * dVar37;
        dVar39 = dVar36 * dVar40 - dVar37 * dVar39;
        dVar42 = dVar35 * dVar37;
        dVar35 = dVar35 * dVar40;
        uVar20 = uVar10;
        pdVar19 = pdVar9;
        lVar32 = lVar12;
        do {
          dVar36 = *(double *)((long)V + (lVar32 >> 0x1d));
          dVar38 = *pdVar19;
          *(double *)((long)V + (lVar32 >> 0x1d)) = dVar36 * dVar40 + dVar37 * dVar38;
          *pdVar19 = dVar38 * dVar40 - dVar37 * dVar36;
          pdVar19 = pdVar19 + uVar10;
          lVar32 = lVar32 + (uVar10 << 0x20);
          uVar20 = uVar20 - 1;
        } while (uVar20 != 0);
        dVar38 = hypot(__x,dVar42);
        dVar42 = dVar42 / dVar38;
        if ((dVar38 == 0.0) && (!NAN(dVar38))) {
          dVar42 = dVar37;
        }
        dVar36 = __x / dVar38;
        if ((dVar38 == 0.0) && (!NAN(dVar38))) {
          dVar36 = dVar40;
        }
        q[lVar24] = dVar38;
        uVar20 = uVar23;
        lVar24 = lVar12;
        pdVar19 = pdVar8;
        if (0 < M) {
          do {
            dVar40 = *(double *)((long)U + (lVar24 >> 0x1d));
            dVar37 = *pdVar19;
            *(double *)((long)U + (lVar24 >> 0x1d)) = dVar40 * dVar36 + dVar42 * dVar37;
            *pdVar19 = dVar37 * dVar36 - dVar42 * dVar40;
            uVar20 = uVar20 - 1;
            lVar24 = lVar24 + (uVar10 << 0x20);
            pdVar19 = pdVar19 + uVar10;
          } while (uVar20 != 0);
        }
        dVar40 = dVar36 * dVar39 + dVar35 * dVar42;
        dVar39 = dVar36 * dVar35 - dVar39 * dVar42;
        pdVar9 = pdVar9 + 1;
        lVar12 = lVar12 + 0x100000000;
        pdVar8 = pdVar8 + 1;
        lVar24 = lVar17;
      } while (lVar17 < (long)uVar11);
    }
    *(undefined8 *)((long)__ptr + lVar6 * 8) = 0;
    *(double *)((long)__ptr + uVar11 * 8) = dVar40;
    q[uVar11] = dVar39;
    iVar5 = iVar5 + 1;
    uVar20 = local_100;
    iVar2 = local_e8;
    if (iVar5 == 0x33) {
      puts("Convergence Not Achieved ");
      return 0xf;
    }
    goto LAB_001220a3;
  }
  if (dVar40 < 0.0) {
    q[uVar11] = -dVar40;
    uVar20 = uVar10;
    pdVar9 = local_118;
    do {
      *pdVar9 = -*pdVar9;
      pdVar9 = pdVar9 + uVar10;
      uVar20 = uVar20 - 1;
    } while (uVar20 != 0);
  }
  local_100 = local_100 - 1;
  local_e8 = local_e8 + -1;
  bVar1 = (long)uVar11 < 1;
  uVar11 = uVar34;
  if (bVar1) goto LAB_00122677;
  goto LAB_0012207a;
}

Assistant:

int svd(double *A,int M,int N,double *U,double *V,double *q) {
	int i,j,k,l,t,t2,ierr,cancel,iter,l1;
	double eps,g,x,s,temp,f,h,c,y,z,scale;
	double *e;
	/*
     THIS SUBROUTINE IS THE MODIFIED C TRANSLATION OF THE
     EISPACK FORTRAN TRANSLATION OF THE ALGOL PROCEDURE SVD,
     NUM. MATH. 14, 403-420(1970) BY GOLUB AND REINSCH.
     HANDBOOK FOR AUTO. COMP., VOL II-LINEAR ALGEBRA, 134-151(1971).
	 */
	/*
	 * U = MXN
	 * V - NXN
	 * Q - NX1
	 */

	/*
	 * The program return error codes
	 *
	 *  Code 0 if the computation is successful
	 *  Code -1 If  M < N . Transpose the matrix such that rows > columns and try again
	 *  Code 15 if maximum iterations are reached without achieving convergence. Increase SVDMAXITER value
	 *  in matrix.h header file. Default Value is 50
	 *
	 */
	if (M < N) {
		printf("Rows (M) should be greater than Columns (B) \n");
		printf("Retry By Transposing the Input Matrix");
		return -1;
	}
	e = (double*) malloc(sizeof(double) * N);
	ierr = 0;
	eps = macheps();
	g = scale = x = 0.0;

	for(i = 0; i < M*N;++i) {
		U[i] = A[i];
	}

	for(i = 0; i < N;++i) {
		l = i+1;
		e[i] = scale * g;
		g = 0.0;
		s = 0.0;
		scale = 0.0;

		if (i < M) {
			for(k = i; k < M;++k) {
				scale += fabs(U[k*N+i]);
			}

			if (scale != 0.0) {
				for(k = i; k < M;++k) {
					t = k * N;
					U[t+i] /= scale;
					temp = U[t+i];
					s += temp*temp;
				}
				f = U[i*N+i];
				g = (f < 0) ? sqrt(s) : -sqrt(s);
				h = f * g - s;
				U[i*N+i] = f - g;

				if (i < N - 1) {
					for(j = l; j < N;++j) {
						s = 0.0;
						for(k = i; k < M;++k) {
							t = k * N;
							s += U[t+i]*U[t+j];
						}
						f = s / h;
						for(k = i; k < M;++k) {
							t = k * N;
							U[t+j] += f * U[t+i];
						}
					}
				}
				for(k = i; k < M;++k) {
					t = k * N;
					U[t+i] *= scale;
				}
			}
		}
        q[i] = scale * g;
        g = 0.0;
        s = 0.0;
        scale = 0.0;

        if (i < M && i != N - 1) {
        	t = i *N;
        	for(k = l; k < M;++k) {
        		scale += fabs(U[t+k]);
        	}
        	if (scale != 0.0) {
        		for(k = l; k < N;++k) {
        			U[t+k] /= scale;
        			temp = U[t+k];
        			s = s + temp*temp;
        		}
        		f = U[t+l];
        		g = (f < 0) ? sqrt(s) : -sqrt(s);
                h = f * g - s;
                U[t+l] = f - g;
                for(k = l;k < N;++k) {
                	e[k] = U[t+k] / h;
                }

				for (j = l; j < M; j++) {
					s = 0.0;
					t2 = j * N;
					for (k = l; k < N; k++) {
						s += U[t2+k] * U[t+k];
					}
					for (k = l; k < N; k++) {
						U[t2+k] += s * e[k];
					}
				}
                for (k = l; k < N; k++)
                    U[t+k] *= scale;
        	}

        }

        temp = fabs(q[i]) + fabs(e[i]);

        if (x < temp) {
        	x = temp;
        }
	}

	/*
	ierr = 0;
	eps = macheps();
	tol = eps;
	g = x = 0.0;

	for(i = 0; i < M*N;++i) {
		U[i] = A[i];
	}

	for(i = 0; i < N;++i) {
		l = i+1;
		e[i] = g;
		s = 0.0;

		for(k = i; k < M;++k) {
			t = k * N;
			temp = U[t+i];
			s += temp*temp;
		}
		if (s < tol) {
			g = 0.0;
		} else {
			f = U[i*N+i];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
			U[i*N+i] = f - g;

			for(j = l; j < N;++j) {
				s = 0.0;
				for(k = i; k < M;++k) {
					t = k * N;
					s += (U[t+i]*U[t+j]);
				}
				f = s / h;
				for(k = i; k < M;++k) {
					t = k * N;
					U[t+j] += (f * U[t+i]);
				}
			}

		}

        q[i] = g;
        s = 0.0;
        t = i * N;
    	for(k = l; k < N;++k) {
    		temp = U[t+k];
    		s = s + temp*temp;
    	}
        if (s < tol) {
        	g = 0.0;
        } else {
        	f = U[t+l];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
            U[t+l] = f - g;
            for(k = l;k < N;++k) {
              	e[k] = U[t+k] / h;
            }

            for (j = l; j < M; j++) {
                s = 0.0;
                t2 = j * N;
                for (k = l; k < N; k++) {
                     s += U[t2+k] * U[t+k];
                }
                for (k = l; k < N; k++) {
                     U[t2+k] += s * e[k];
                }
            }

        }

        temp = fabs(q[i]) + fabs(e[i]);

        if (x < temp) {
        	x = temp;
        }
	}
*/


//Accumulating Right Hand Transformations

	for(i = N - 1;i >= 0;--i) {
		t = i * N;
		if (i < N - 1) {
			if (g != 0.0) {
				h = U[t+i+1] * g;
				for(j = l;j < N;++j) {
					V[j*N+i] = U[t+j] / h;
				}
				for(j = l;j < N;++j) {
					s = 0.0;
					for(k = l; k < N;++k) {
						s += U[t+k] * V[k*N+j];
					}
					for(k = l; k < N;++k) {
						V[k*N+j] += (s * V[k*N+i]);
					}
				}
			}
			for(j = l; j < N;++j) {
				V[t+j] = V[j*N+i] = 0.0;
			}
		}
	    V[t+i] = 1.0;
		g = e[i];
		l = i;
	}



//Accumulating Left Hand Transformations

	for(i = N - 1;i >= 0;--i) {
		t = i * N;
		l = i+1;
		g = q[i];

		if (i < N - 1) {
			for(j = l;j < N;++j) {
				U[t+j] = 0.0;
			}
		}

		if (g != 0.0) {
			if (i != N - 1) {
				//h = U[t+i] * g;
				for(j = l;j < N;++j) {
					s = 0.0;
					for(k = l; k < M;++k) {
						s += (U[k*N+i] * U[k*N+j]);
					}
					f = (s / U[t+i]) / g;
					for(k = i; k < M;++k) {
						U[k*N+j] += (f * U[k*N+i]);
					}
				}
			}
			for(j = i; j < M;++j) {
				U[j*N+i] = U[j*N+i] / g;
			}
		} else {
			for(j = i; j < M;++j) {
				U[j*N+i] = 0.0;
			}
		}

		U[t+i] += 1.0;
	}
//	mdisplay(U,M,N);

	eps = eps * x;

	for(k = N - 1; k >= 0; --k) {
		iter = 0;

		while(1) {
			iter++;
			if (iter > SVDMAXITER) {
				printf("Convergence Not Achieved \n");
				return 15;
			}

			cancel = 1;
			for(l = k; l >= 0; --l) {
				if (fabs(e[l]) <= eps) {
					cancel = 0; //test f convergence
					break;
				}
				if (fabs(q[l-1]) <= eps) {
					//Cancel
					break;
				}
			}
			if (cancel) {
				c = 0.0;
				s = 1.0;
				l1 = l - 1;
				for(i = l; i <= k;++i) {
					f = s*e[i];
					e[i] *= c;
					if (fabs(f) <= eps) {
						break;
					}
					g = q[i];
					h = q[i] = hypot(f,g);
					c = g/h;
					s = -f/h;
					for(j = 0; j < M;++j) {
						t = j * N;
						y = U[t+l1];
						z = U[t+i];

						U[t+l1] = y * c + z * s;
						U[t+i] = z * c - y * s;
					}
				}
			}
			z = q[k];
			if (l != k) {
				x = q[l];
				y = q[k-1];
				g = e[k-1];
				h = e[k];
				f = 0.5 * (((g + z) / h) * ((g - z) / y) + y / h - h / y);
				g = hypot(f,1.0);
				if (f < 0.0) {
					temp = f - g;
				} else {
					temp = f+g;
				}
				f = x - (z / x) * z + (h / x) * (y / temp - h);

				//Next QR Transformation

				c = s = 1.0;
				for(i = l+1; i <= k;++i) {
					g = e[i];
					y = q[i];
					h = s * g;
					g = c * g;
					e[i-1] = z = hypot(f,h);
                    c = f / z;
                    s = h / z;
                    f = x * c + g * s;
                    g = g * c - x * s;
                    h = y * s;
                    y *= c;
                    for(j = 0; j < N;++j) {
                    	t = j * N;
                        x = V[t+i-1];
                        z = V[t+i];
                        V[t+i-1] = x * c + z * s;
                        V[t+i] = z * c - x * s;
                    }
                    q[i-1] = z = hypot(f,h);
                    if (z != 0.0) {
                        c = f / z;
                        s = h / z;
                    }
                    f = c * g + s * y;
                    x = c * y - s * g;
                    for(j = 0; j < M;++j) {
                    	t = j * N;
                        y = U[t+i-1];
                        z = U[t+i];
                        U[t+i-1] = y * c + z * s;
                        U[t+i] = z * c - y * s;
                    }
				}
                    e[l] = 0.0;
                    e[k] = f;
                    q[k] = x;

			} else {
				//convergence
                if (z < 0.0) {
                    q[k] = -z;
                    for (j = 0; j < N; j++) {
                    	t = j *N;
                        V[t+k] = -V[t+k];
                    }
                }
                break;
			}
		}
	}

	svd_sort(U,M,N,V,q);

	free(e);
	return ierr;
}